

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall deqp::gls::BuiltinPrecisionTests::Functions::Min::~Min(Min *this)

{
  Min *this_local;
  
  ~Min(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

Max (void) : PreciseFunc2("max", deMax) {}